

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
::_reduce_boundary<std::initializer_list<unsigned_int>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
          *this,ID_index cellID,initializer_list<unsigned_int> *boundary,Dimension dim)

{
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
  *pCVar1;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
  *targetColumn;
  uint uVar2;
  ID_index IVar3;
  Dimension DVar4;
  uint uVar5;
  undefined4 uVar6;
  iterator __position;
  pointer puVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  mapped_type *__args;
  _List_node_base *p_Var11;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
  *source;
  undefined8 *puVar12;
  uint *puVar13;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
  *pvVar14;
  ulong uVar15;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
  *pCVar16;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
  *pvVar17;
  Pos_index pairPos;
  undefined8 *puVar18;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_b8;
  uint local_ac;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_a8;
  ID_index local_a0;
  anon_class_1_0_00000001 local_9b;
  anon_class_1_0_00000001 local_9a;
  anon_class_1_0_00000001 local_99;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>
  *local_78;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
  *local_70;
  ulong local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  uVar15 = (ulong)(uint)dim;
  local_a0 = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<unsigned_int_const*>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
             boundary->_M_array,boundary->_M_array + boundary->_M_len);
  if (dim == -1) {
    if (boundary->_M_len == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)((int)boundary->_M_len - 1);
    }
  }
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if (boundary->_M_len == 0) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_a0);
    local_b8._M_node._0_4_ = *(undefined4 *)(this + 0xb0);
    local_ac = (uint)uVar15;
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar2 = *(uint *)(lVar9 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
    ::
    emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                *)(this + 0x80),(uint *)&local_b8,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &local_60,(int *)&local_ac,
               (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>_>_>
                **)(this + 0x78),(Column_z2_settings **)(this + 0xb8));
    *(uint *)(*(long *)(this + 0x98) + (ulong)uVar2 * 4) = (uint)local_b8._M_node;
    p_Var11 = (_List_node_base *)operator_new(0x20);
    pCVar1 = this + 0x70;
    uVar6 = *(undefined4 *)(this + 0x70);
    *(uint *)&p_Var11[1]._M_next = (uint)uVar15;
    *(undefined4 *)((long)&p_Var11[1]._M_next + 4) = uVar6;
    *(undefined4 *)&p_Var11[1]._M_prev = 0xffffffff;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    local_b8._M_node = *(_List_node_base **)(this + 0x28);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x38),(const_iterator)0x0,(uint *)pCVar1,&local_b8);
    pCVar16 = this + 0xb0;
    *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
  }
  else {
    local_68 = uVar15;
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    lVar9 = (ulong)*(uint *)(*(long *)(this + 0x98) + (ulong)*(uint *)(lVar9 + 0x20) * 4) * 0x40;
    local_78 = this;
    if (*(int *)(*(long *)(this + 0x80) + 0x18 + lVar9) != -1) {
      lVar9 = *(long *)(this + 0x80) + lVar9;
      do {
        for (puVar12 = *(undefined8 **)(lVar9 + 0x30); puVar12 != (undefined8 *)(lVar9 + 0x30);
            puVar12 = (undefined8 *)*puVar12) {
          local_b8._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
          pVar19 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar19.first._M_node);
          }
        }
        local_b8._M_node._0_4_ = *(uint *)(lVar9 + 0x18);
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b8);
        }
        else {
          *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = *(uint *)(lVar9 + 0x18);
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        this = local_78;
        if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
          local_ac = local_a0;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_60,&local_ac);
          puVar7 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_70 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                      *)(this + 0x80);
          if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pvVar17 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                       *)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            do {
              puVar18 = (undefined8 *)(*(long *)local_70 + (ulong)*(uint *)pvVar17 * 0x40 + 0x30);
              for (puVar12 = (undefined8 *)*puVar18; puVar12 != puVar18;
                  puVar12 = (undefined8 *)*puVar12) {
                local_b8._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
                pVar19 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
                if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                      *)&local_60,(_Base_ptr)pVar19.first._M_node);
                }
              }
              pvVar17 = pvVar17 + 4;
            } while (pvVar17 !=
                     (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                      *)puVar7);
          }
          pCVar16 = local_78;
          local_b8._M_node._0_4_ = *(undefined4 *)(local_78 + 0xb0);
          local_ac = (uint)local_68;
          lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
          uVar2 = *(uint *)(lVar9 + 0x20);
          std::
          vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
          ::
          emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::Column_z2_settings*&>
                    (local_70,(uint *)&local_b8,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &local_60,(int *)&local_ac,
                     (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>_>_>
                      **)(pCVar16 + 0x78),(Column_z2_settings **)(pCVar16 + 0xb8));
          *(uint *)(*(long *)(pCVar16 + 0x98) + (ulong)uVar2 * 4) = (uint)local_b8._M_node;
          p_Var11 = (_List_node_base *)operator_new(0x20);
          pCVar1 = pCVar16 + 0x70;
          uVar6 = *(undefined4 *)(pCVar16 + 0x70);
          *(int *)&p_Var11[1]._M_next = (int)local_68;
          *(undefined4 *)((long)&p_Var11[1]._M_next + 4) = uVar6;
          *(undefined4 *)&p_Var11[1]._M_prev = 0xffffffff;
          std::__detail::_List_node_base::_M_hook(p_Var11);
          *(long *)(pCVar16 + 0x30) = *(long *)(pCVar16 + 0x30) + 1;
          local_b8._M_node = *(_List_node_base **)(pCVar16 + 0x28);
          std::__detail::
          _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                    ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(pCVar16 + 0x38),(const_iterator)0x0,(uint *)pCVar1,&local_b8);
          pCVar16 = pCVar16 + 0xb0;
          *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
          goto LAB_001894b3;
        }
        lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        lVar10 = (ulong)*(uint *)(*(long *)(this + 0x98) + (ulong)*(uint *)(lVar9 + 0x20) * 4) *
                 0x40;
        lVar9 = *(long *)(this + 0x80) + lVar10;
      } while (*(int *)(*(long *)(this + 0x80) + 0x18 + lVar10) != -1);
    }
    if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
      do {
        lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        lVar9 = *(long *)(this + 0x80);
        uVar2 = *(uint *)(*(long *)(this + 0x98) + (ulong)*(uint *)(lVar10 + 0x20) * 4);
        lVar10 = (ulong)uVar2 * 0x40;
        if (*(int *)(lVar9 + 0x18 + lVar10) == -1) {
          puVar18 = (undefined8 *)(lVar9 + lVar10 + 0x30);
          local_ac = uVar2;
          for (puVar12 = (undefined8 *)*puVar18; puVar12 != puVar18;
              puVar12 = (undefined8 *)*puVar12) {
            local_b8._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
            pVar19 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
            if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_60,(_Base_ptr)pVar19.first._M_node);
            }
          }
          __position._M_current = *(uint **)(local_a8 + 8);
          if (__position._M_current == *(uint **)(local_a8 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_a8,__position,&local_ac);
          }
          else {
            *__position._M_current = local_ac;
            *(uint **)(local_a8 + 8) = __position._M_current + 1;
          }
        }
        else {
          lVar9 = lVar9 + lVar10;
          for (puVar12 = *(undefined8 **)(lVar9 + 0x30); puVar12 != (undefined8 *)(lVar9 + 0x30);
              puVar12 = (undefined8 *)*puVar12) {
            local_b8._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
            pVar19 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
            if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_60,(_Base_ptr)pVar19.first._M_node);
            }
          }
          local_b8._M_node._0_4_ = *(uint *)(lVar9 + 0x18);
          if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b8);
          }
          else {
            *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = *(uint *)(lVar9 + 0x18);
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
    }
    pvVar17 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
               *)(this + 0x80);
    puVar13 = *(uint **)local_a8 + 1;
    if (puVar13 != *(uint **)(local_a8 + 8)) {
      lVar9 = (ulong)**(uint **)local_a8 * 0x40;
      do {
        lVar10 = *(long *)pvVar17;
        targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
                        *)(lVar10 + lVar9);
        uVar2 = *(uint *)(lVar10 + 0x14 + lVar9);
        source = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
                  *)((ulong)*puVar13 * 0x40 + lVar10);
        local_b8._M_node = (_List_node_base *)targetColumn;
        bVar8 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gud___ersistence_matrix::Column_types)7,false,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (source,targetColumn,(anon_class_1_0_00000001 *)&local_ac,
                           (anon_class_8_1_e4bd5e45 *)&local_b8,&local_99,&local_9a,&local_9b);
        if (bVar8) {
          IVar3 = (targetColumn->super_Chain_column_option).pivot_;
          (targetColumn->super_Chain_column_option).pivot_ =
               (source->super_Chain_column_option).pivot_;
          (source->super_Chain_column_option).pivot_ = IVar3;
          DVar4 = (targetColumn->super_Column_dimension_option).dim_;
          (targetColumn->super_Column_dimension_option).dim_ =
               (source->super_Column_dimension_option).dim_;
          (source->super_Column_dimension_option).dim_ = DVar4;
        }
        uVar5 = (targetColumn->super_Chain_column_option).pivot_;
        if (uVar2 != uVar5) {
          lVar10 = *(long *)(local_78 + 0x98);
          uVar6 = *(undefined4 *)(lVar10 + (ulong)uVar2 * 4);
          *(undefined4 *)(lVar10 + (ulong)uVar2 * 4) = *(undefined4 *)(lVar10 + (ulong)uVar5 * 4);
          *(undefined4 *)(lVar10 + (ulong)uVar5 * 4) = uVar6;
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != *(uint **)(local_a8 + 8));
    }
    local_ac = local_a0;
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_ac);
    local_70 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                *)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar14 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
                 *)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      do {
        puVar18 = (undefined8 *)(*(long *)pvVar17 + (ulong)*(uint *)pvVar14 * 0x40 + 0x30);
        for (puVar12 = (undefined8 *)*puVar18; puVar12 != puVar18; puVar12 = (undefined8 *)*puVar12)
        {
          local_b8._M_node._0_4_ = *(undefined4 *)(puVar12 + 2);
          pVar19 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar19.first._M_node);
          }
        }
        pvVar14 = pvVar14 + 4;
      } while (pvVar14 != local_70);
    }
    pCVar16 = local_78;
    uVar2 = **(uint **)local_a8;
    local_ac = (uint)local_68;
    local_b8._M_node._0_4_ = *(undefined4 *)(local_78 + 0xb0);
    lVar9 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar5 = *(uint *)(lVar9 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
    ::
    emplace_back<unsigned_int&,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,std::vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>,std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>::Column_z2_settings*&>
              (pvVar17,(uint *)&local_b8,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &local_60,(int *)&local_ac,
               (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>_>_>
                **)(pCVar16 + 0x78),(Column_z2_settings **)(pCVar16 + 0xb8));
    *(uint *)(*(long *)(pCVar16 + 0x98) + (ulong)uVar5 * 4) = (uint)local_b8._M_node;
    uVar5 = *(uint *)(pCVar16 + 0xb0);
    lVar9 = *(long *)(pCVar16 + 0x80);
    *(uint *)(lVar9 + 0x18 + (ulong)uVar5 * 0x40) = uVar2;
    *(uint *)(lVar9 + 0x18 + (ulong)uVar2 * 0x40) = uVar5;
    local_b8._M_node._0_4_ = uVar2;
    __args = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(pCVar16 + 0x38),(key_type *)&local_b8);
    pCVar1 = pCVar16 + 0x70;
    *(undefined4 *)&__args->_M_node[1]._M_prev = *(undefined4 *)(pCVar16 + 0x70);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(pCVar16 + 0x38),(const_iterator)0x0,(uint *)pCVar1,__args);
    pCVar16 = pCVar16 + 0xb0;
    *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
  }
LAB_001894b3:
  *(int *)pCVar16 = *(int *)pCVar16 + 1;
  if ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
       *)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,true>>>>>
       *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}